

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_subset.c
# Opt level: O0

_Bool bitset_container_is_subset_run(bitset_container_t *container1,run_container_t *container2)

{
  ushort uVar1;
  short sVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int *in_RSI;
  int *in_RDI;
  uint16_t r;
  uint64_t t;
  uint32_t stop;
  uint32_t start;
  uint64_t w;
  int32_t i_run;
  int32_t i_bitset;
  undefined4 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbc;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  bool bVar7;
  ulong local_28;
  int local_20;
  int local_1c;
  
  if ((*in_RDI == -1) ||
     (iVar6 = *in_RDI,
     iVar4 = run_container_cardinality
                       ((run_container_t *)
                        CONCAT17(in_stack_ffffffffffffffbf,
                                 CONCAT16(in_stack_ffffffffffffffbe,
                                          CONCAT24(in_stack_ffffffffffffffbc,
                                                   in_stack_ffffffffffffffb8)))), iVar6 <= iVar4)) {
    local_1c = 0;
    local_20 = 0;
    while( true ) {
      bVar7 = false;
      if (local_1c < 0x400) {
        bVar7 = local_20 < *in_RSI;
      }
      if (!bVar7) {
        if (local_1c < 0x400) {
          for (; local_1c < 0x400; local_1c = local_1c + 1) {
            if (*(long *)(*(long *)(in_RDI + 2) + (long)local_1c * 8) != 0) {
              return false;
            }
          }
        }
        return true;
      }
      local_28 = *(ulong *)(*(long *)(in_RDI + 2) + (long)local_1c * 8);
      while( true ) {
        bVar7 = false;
        if (local_28 != 0) {
          bVar7 = local_20 < *in_RSI;
        }
        if (!bVar7) break;
        uVar5 = (uint)*(ushort *)(*(long *)(in_RSI + 2) + (long)local_20 * 4);
        uVar1 = *(ushort *)(*(long *)(in_RSI + 2) + 2 + (long)local_20 * 4);
        sVar2 = (short)(local_1c << 6);
        iVar6 = roaring_trailing_zeroes(local_28);
        uVar3 = sVar2 + (short)iVar6;
        if (uVar3 < uVar5) {
          return false;
        }
        if (uVar5 + uVar1 < (uint)uVar3) {
          local_20 = local_20 + 1;
        }
        else {
          local_28 = local_28 & (local_28 ^ 0xffffffffffffffff) + 1 ^ local_28;
        }
      }
      if (local_28 != 0) break;
      local_1c = local_1c + 1;
    }
  }
  return false;
}

Assistant:

bool bitset_container_is_subset_run(const bitset_container_t* container1,
                                    const run_container_t* container2) {
    // todo: this code could be much faster
    if (container1->cardinality != BITSET_UNKNOWN_CARDINALITY) {
        if (container1->cardinality > run_container_cardinality(container2)) {
            return false;
        }
    }
    int32_t i_bitset = 0, i_run = 0;
    while (i_bitset < BITSET_CONTAINER_SIZE_IN_WORDS &&
           i_run < container2->n_runs) {
        uint64_t w = container1->words[i_bitset];
        while (w != 0 && i_run < container2->n_runs) {
            uint32_t start = container2->runs[i_run].value;
            uint32_t stop = start + container2->runs[i_run].length;
            uint64_t t = w & (~w + 1);
            uint16_t r = i_bitset * 64 + roaring_trailing_zeroes(w);
            if (r < start) {
                return false;
            } else if (r > stop) {
                i_run++;
                continue;
            } else {
                w ^= t;
            }
        }
        if (w == 0) {
            i_bitset++;
        } else {
            return false;
        }
    }
    if (i_bitset < BITSET_CONTAINER_SIZE_IN_WORDS) {
        // terminated iterating on the run containers, check that rest of bitset
        // is empty
        for (; i_bitset < BITSET_CONTAINER_SIZE_IN_WORDS; i_bitset++) {
            if (container1->words[i_bitset] != 0) {
                return false;
            }
        }
    }
    return true;
}